

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O1

void __thiscall embree::TutorialApplication::run(TutorialApplication *this,int argc,char **argv)

{
  pointer pcVar1;
  int iVar2;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  rtcSetDeviceProperty(0,1000000,(long)this->debug0);
  rtcSetDeviceProperty(0,0xf4241,(long)this->debug1);
  rtcSetDeviceProperty(0,0xf4242,(long)this->debug2);
  rtcSetDeviceProperty(0,0xf4243,(long)this->debug3);
  device_init((this->super_Application).rtcore._M_dataplus._M_p);
  pcVar1 = (this->outputImageFilename).filename._M_dataplus._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,
             pcVar1 + (this->outputImageFilename).filename._M_string_length);
  iVar2 = std::__cxx11::string::compare((char *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  if (iVar2 != 0) {
    renderToFile(this,&this->outputImageFilename);
  }
  pcVar1 = (this->referenceImageFilename).filename._M_dataplus._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,
             pcVar1 + (this->referenceImageFilename).filename._M_string_length);
  iVar2 = std::__cxx11::string::compare((char *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  if (iVar2 != 0) {
    compareToReferenceImage(this,&this->referenceImageFilename);
  }
  if (this->interactive == true) {
    renderInteractive(this);
  }
  return;
}

Assistant:

void TutorialApplication::run(int argc, char** argv)
  {
    /* set debug values */
    rtcSetDeviceProperty(nullptr,(RTCDeviceProperty) 1000000, debug0);
    rtcSetDeviceProperty(nullptr,(RTCDeviceProperty) 1000001, debug1);
    rtcSetDeviceProperty(nullptr,(RTCDeviceProperty) 1000002, debug2);
    rtcSetDeviceProperty(nullptr,(RTCDeviceProperty) 1000003, debug3);

    /* initialize ray tracing core */
    device_init(rtcore.c_str());

    /* render to disk */
    if (outputImageFilename.str() != "")
      renderToFile(outputImageFilename);

    /* compare to reference image */
    if (referenceImageFilename.str() != "")
      compareToReferenceImage(referenceImageFilename);

#if defined(USE_GLFW)
    
    /* interactive mode */
    if (interactive)
      renderInteractive();
    
#else
    if (interactive) 
      std::cout << "GLFW is disabled, you can only render to disk using -o command line option." << std::endl;
#endif
  }